

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SpatialInertia.cpp
# Opt level: O1

Matrix6x6 * __thiscall
iDynTree::SpatialInertia::biasWrenchDerivative
          (Matrix6x6 *__return_storage_ptr__,SpatialInertia *this,Twist *V)

{
  double *pdVar1;
  undefined8 *puVar2;
  double dVar3;
  undefined8 uVar4;
  long lVar5;
  double dVar6;
  double dVar7;
  double dVar8;
  SrcEvaluatorType srcEvaluator;
  Matrix<double,_3,_3,_1,_3,_3> mcCrossOmegaCross;
  DstEvaluatorType dstEvaluator;
  assign_op<double,_double> local_259;
  AngularVector3T *local_258;
  undefined1 local_250 [24];
  double *pdStack_238;
  double local_230;
  double local_228;
  double dStack_220;
  double local_218;
  double local_210;
  Matrix<double,_3,_3,_0,_3,_3> local_208;
  Matrix<double,_3,_3,_0,_3,_3> local_1c0;
  double local_178;
  double dStack_170;
  double local_168;
  double dStack_160;
  double local_158;
  double local_150;
  double local_148;
  double local_140;
  double local_138;
  undefined1 local_128 [32];
  variable_if_dynamic<long,__1> local_108;
  variable_if_dynamic<long,__1> local_100;
  Index local_f8;
  RotationalInertia *local_f0 [2];
  AngularVector3T *local_e0;
  Matrix<double,_3,_3,_0,_3,_3> local_d0;
  CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::Product<Eigen::CwiseUnaryOp<Eigen::internal::scalar_opposite_op<double>,_const_Eigen::Matrix<double,_3,_3,_0,_3,_3>_>,_Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0>,_const_Eigen::Product<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_Eigen::Map<const_Eigen::Matrix<double,_3,_3,_1,_3,_3>,_0,_Eigen::Stride<0,_0>_>,_0>_>,_const_Eigen::Matrix<double,_3,_3,_0,_3,_3>_>
  local_88;
  
  local_258 = &(V->super_SpatialMotionVector).super_SpatialVector<iDynTree::SpatialMotionVector>.
               angularVec3;
  local_88.m_lhs.m_rhs.m_lhs = (LhsNested)this->m_mcom[0];
  local_208.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[0] =
       (double)&local_88;
  local_88._0_8_ = 0;
  local_88.m_lhs.m_rhs.m_rhs.
  super_MapBase<Eigen::Map<const_Eigen::Matrix<double,_3,_3,_1,_3,_3>,_0,_Eigen::Stride<0,_0>_>,_0>.
  m_data = (PointerType)this->m_mcom[1];
  local_88.m_lhs.m_lhs.m_lhs._8_4_ = *(undefined4 *)(this->m_mcom + 2);
  local_88.m_lhs.m_lhs.m_lhs._12_4_ = *(uint *)((long)this->m_mcom + 0x14) ^ 0x80000000;
  local_88.m_lhs.m_lhs.m_lhs.m_xpr = (XprTypeNested)((ulong)this->m_mcom[1] ^ 0x8000000000000000);
  local_88.m_lhs.m_lhs.m_rhs = (RhsNested)0x0;
  local_88.m_lhs.m_rhs.m_rhs.
  super_MapBase<Eigen::Map<const_Eigen::Matrix<double,_3,_3,_1,_3,_3>,_0,_Eigen::Stride<0,_0>_>,_0>.
  _8_4_ = SUB84(local_88.m_lhs.m_rhs.m_lhs,0);
  local_88.m_lhs.m_rhs.m_rhs.
  super_MapBase<Eigen::Map<const_Eigen::Matrix<double,_3,_3,_1,_3,_3>,_0,_Eigen::Stride<0,_0>_>,_0>.
  _12_4_ = (uint)((ulong)local_88.m_lhs.m_rhs.m_lhs >> 0x20) ^ 0x80000000;
  local_88.m_lhs._56_8_ = 0;
  local_1c0.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[5] =
       (V->super_SpatialMotionVector).super_SpatialVector<iDynTree::SpatialMotionVector>.angularVec3
       .super_Vector3.m_data[0];
  local_1c0.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[0] =
       0.0;
  pdVar1 = (V->super_SpatialMotionVector).super_SpatialVector<iDynTree::SpatialMotionVector>.
           angularVec3.super_Vector3.m_data + 1;
  local_1c0.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[6] =
       *pdVar1;
  local_1c0.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[2] =
       -*pdVar1;
  local_1c0.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[3] =
       -(V->super_SpatialMotionVector).super_SpatialVector<iDynTree::SpatialMotionVector>.
        angularVec3.super_Vector3.m_data[2];
  local_1c0.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[4] =
       0.0;
  local_1c0.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[7] =
       -local_1c0.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
        array[5];
  local_1c0.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[8] =
       0.0;
  local_250._8_8_ = &local_208;
  local_208.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[4] =
       1.48219693752374e-323;
  local_d0.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[0] =
       (double)&local_178;
  local_250._0_8_ = &local_d0;
  pdStack_238 = (double *)
                local_d0.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
                m_data.array[0];
  local_250._16_8_ = local_128;
  local_208.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[1] =
       (double)&local_1c0;
  local_208.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[2] =
       local_208.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array
       [0];
  local_208.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[3] =
       (double)&local_1c0;
  Eigen::internal::
  copy_using_evaluator_DefaultTraversal_CompleteUnrolling<Eigen::internal::generic_dense_assignment_kernel<Eigen::internal::evaluator<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>,_Eigen::internal::evaluator<Eigen::Product<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1>_>,_Eigen::internal::assign_op<double,_double>,_0>,_0,_9>
  ::run((generic_dense_assignment_kernel<Eigen::internal::evaluator<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>,_Eigen::internal::evaluator<Eigen::Product<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1>_>,_Eigen::internal::assign_op<double,_double>,_0>
         *)local_250);
  dVar3 = this->m_mass;
  local_250._8_8_ =
       (V->super_SpatialMotionVector).super_SpatialVector<iDynTree::SpatialMotionVector>.angularVec3
       .super_Vector3.m_data[2];
  local_228 = (V->super_SpatialMotionVector).super_SpatialVector<iDynTree::SpatialMotionVector>.
              angularVec3.super_Vector3.m_data[0];
  dStack_220 = (V->super_SpatialMotionVector).super_SpatialVector<iDynTree::SpatialMotionVector>.
               angularVec3.super_Vector3.m_data[1];
  __return_storage_ptr__->m_data[0] = 0.0;
  __return_storage_ptr__->m_data[1] = -(dVar3 * (double)local_250._8_8_);
  __return_storage_ptr__->m_data[2] = dVar3 * dStack_220;
  __return_storage_ptr__->m_data[6] = dVar3 * (double)local_250._8_8_;
  __return_storage_ptr__->m_data[7] = 0.0;
  __return_storage_ptr__->m_data[8] = -(dVar3 * local_228);
  __return_storage_ptr__->m_data[0xc] = -(dVar3 * dStack_220);
  __return_storage_ptr__->m_data[0xd] = dVar3 * local_228;
  __return_storage_ptr__->m_data[0xe] = 0.0;
  local_208.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[1] =
       (V->super_SpatialMotionVector).super_SpatialVector<iDynTree::SpatialMotionVector>.linearVec3.
       super_Vector3.m_data[2];
  local_208.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[5] =
       (V->super_SpatialMotionVector).super_SpatialVector<iDynTree::SpatialMotionVector>.linearVec3.
       super_Vector3.m_data[0];
  local_208.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[6] =
       (V->super_SpatialMotionVector).super_SpatialVector<iDynTree::SpatialMotionVector>.linearVec3.
       super_Vector3.m_data[1];
  local_1c0.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[5] =
       this->m_mcom[0];
  local_1c0.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[6] =
       this->m_mcom[1];
  local_1c0.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[1] =
       this->m_mcom[2];
  local_1c0.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[2] =
       -local_1c0.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
        array[6];
  local_1c0.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[3] =
       -local_1c0.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
        array[1];
  dVar6 = dStack_220 *
          local_1c0.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
          array[5] +
          local_228 *
          local_1c0.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
          array[2];
  dVar7 = local_1c0.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
          array[6] * (double)local_250._8_8_ +
          dStack_220 *
          local_1c0.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
          array[3];
  dVar8 = local_1c0.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
          array[1] * local_228 -
          (double)local_250._8_8_ *
          local_1c0.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
          array[5];
  __return_storage_ptr__->m_data[3] = 0.0 - local_178;
  __return_storage_ptr__->m_data[4] =
       (dVar3 * local_208.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
                m_data.array[1] - dVar6) - dStack_160;
  __return_storage_ptr__->m_data[5] =
       (dVar8 - local_208.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
                m_data.array[6] * dVar3) - local_148;
  __return_storage_ptr__->m_data[9] =
       (dVar6 - dVar3 * local_208.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
                        m_storage.m_data.array[1]) - dStack_170;
  __return_storage_ptr__->m_data[10] = 0.0 - local_158;
  __return_storage_ptr__->m_data[0xb] =
       (dVar3 * local_208.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
                m_data.array[5] - dVar7) - local_140;
  __return_storage_ptr__->m_data[0xf] =
       (local_208.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
        array[6] * dVar3 - dVar8) - local_168;
  __return_storage_ptr__->m_data[0x10] =
       (dVar7 - dVar3 * local_208.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
                        m_storage.m_data.array[5]) - local_150;
  __return_storage_ptr__->m_data[0x11] = 0.0 - local_138;
  local_1c0.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[7] =
       -local_1c0.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
        array[5];
  lVar5 = 0x50;
  do {
    uVar4 = *(undefined8 *)
             ((long)local_1c0.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage
                    .m_data.array + lVar5);
    puVar2 = (undefined8 *)((long)__return_storage_ptr__->m_data + lVar5 * 2 + -0x10);
    *puVar2 = *(undefined8 *)
               ((long)local_208.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
                      m_storage.m_data.array + lVar5 + 0x40);
    puVar2[1] = uVar4;
    *(undefined8 *)((long)__return_storage_ptr__->m_data + lVar5 * 2) =
         *(undefined8 *)
          ((long)local_1c0.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
                 m_data.array + lVar5 + 8);
    lVar5 = lVar5 + 0x18;
  } while (lVar5 != 0x98);
  local_1c0.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[0] =
       0.0;
  local_1c0.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[4] =
       0.0;
  local_1c0.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[8] =
       0.0;
  local_208.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[7] =
       -local_208.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
        array[5];
  local_208.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[0] =
       0.0;
  local_208.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[2] =
       -local_208.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
        array[6];
  local_208.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[3] =
       -local_208.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
        array[1];
  local_208.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[4] =
       0.0;
  local_208.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[8] =
       0.0;
  local_218 = -local_228;
  local_250._0_8_ = (DstEvaluatorType *)0x0;
  unique0x1000027b = (int)local_250._8_8_;
  local_250._16_8_ = -dStack_220;
  unique0x1000027f = (uint)((ulong)local_250._8_8_ >> 0x20) ^ 0x80000000;
  local_230 = 0.0;
  local_210 = 0.0;
  local_e0 = local_258;
  local_f0[0] = &this->m_rotInertia;
  mySkewIn<Eigen::Product<Eigen::Map<Eigen::Matrix<double,3,3,1,3,3>const,0,Eigen::Stride<0,0>>,Eigen::Map<Eigen::Matrix<double,3,1,0,3,1>const,0,Eigen::Stride<0,0>>,0>>
            ((MatrixBase<Eigen::Product<Eigen::Map<const_Eigen::Matrix<double,_3,_3,_1,_3,_3>,_0,_Eigen::Stride<0,_0>_>,_Eigen::Map<const_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0,_Eigen::Stride<0,_0>_>,_0>_>
              *)local_f0);
  local_88.m_lhs.m_lhs.m_rhs = &local_208;
  local_88.m_lhs.m_rhs.m_lhs = (LhsNested)local_250;
  local_128._0_8_ = __return_storage_ptr__->m_data + 0x15;
  local_108.m_value = 3;
  local_100.m_value = 3;
  local_f8 = 6;
  local_128._16_8_ = __return_storage_ptr__;
  local_88.m_lhs.m_lhs.m_lhs.m_xpr = &local_1c0;
  local_88.m_lhs.m_rhs.m_rhs.
  super_MapBase<Eigen::Map<const_Eigen::Matrix<double,_3,_3,_1,_3,_3>,_0,_Eigen::Stride<0,_0>_>,_0>.
  m_data = (PointerType)&this->m_rotInertia;
  local_88.m_rhs = &local_d0;
  Eigen::internal::
  call_dense_assignment_loop<Eigen::Block<Eigen::Map<Eigen::Matrix<double,6,6,1,6,6>,0,Eigen::Stride<0,0>>,3,3,false>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::Product<Eigen::CwiseUnaryOp<Eigen::internal::scalar_opposite_op<double>,Eigen::Matrix<double,3,3,0,3,3>const>,Eigen::Matrix<double,3,3,0,3,3>,0>const,Eigen::Product<Eigen::Matrix<double,3,3,0,3,3>,Eigen::Map<Eigen::Matrix<double,3,3,1,3,3>const,0,Eigen::Stride<0,0>>,0>const>const,Eigen::Matrix<double,3,3,0,3,3>const>,Eigen::internal::assign_op<double,double>>
            ((Block<Eigen::Map<Eigen::Matrix<double,_6,_6,_1,_6,_6>,_0,_Eigen::Stride<0,_0>_>,_3,_3,_false>
              *)local_128,&local_88,&local_259);
  return __return_storage_ptr__;
}

Assistant:

Matrix6x6 SpatialInertia::biasWrenchDerivative(const Twist& V) const
{
    Matrix6x6 ret;

    Eigen::Map<const Eigen::Vector3d> linearVel(V.getLinearVec3().data());
    Eigen::Map<const Eigen::Vector3d> angularVel(V.getAngularVec3().data());

    Eigen::Map< Eigen::Matrix<double,6,6,Eigen::RowMajor> > retEigen(ret.data());

    Eigen::Map<const Eigen::Vector3d> mcom(this->m_mcom);
    Eigen::Map<const Eigen::Matrix<double,3,3,Eigen::RowMajor> > I(this->m_rotInertia.data());

    Eigen::Matrix<double,3,3,Eigen::RowMajor> mcCrossOmegaCross = mySkewIn(mcom)*mySkewIn(angularVel);
    retEigen.block<3,3>(0,0) = mySkewIn(this->m_mass*angularVel);
    retEigen.block<3,3>(0,3) = -mySkewIn(this->m_mass*linearVel) + mySkewIn(mcom.cross(angularVel)) - mcCrossOmegaCross.transpose();
    retEigen.block<3,3>(3,0) = mcCrossOmegaCross;
    retEigen.block<3,3>(3,3) = -mySkewIn(mcom)*mySkewIn(linearVel) + mySkewIn(angularVel)*I - mySkewIn(I*angularVel);

    return ret;
}